

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void * sysbvm_jit_getTrampolineOrEntryPointForBytecode
                 (sysbvm_bytecodeJit_t *jit,sysbvm_functionBytecode_t *bytecode)

{
  _Bool _Var1;
  ulong uVar2;
  uint8_t *trampolineExecutablePointer;
  uint8_t *trampolineWritePointer;
  void *local_30;
  undefined8 *local_28;
  
  uVar2 = bytecode->jittedCode;
  if (((uVar2 == 0) || (bytecode->jittedCodeSessionToken != (jit->context->roots).sessionToken)) &&
     ((uVar2 = bytecode->jittedCodeTrampoline, uVar2 == 0 ||
      (bytecode->jittedCodeTrampolineSessionToken != (jit->context->roots).sessionToken)))) {
    local_28 = (undefined8 *)0x0;
    local_30 = (void *)0x0;
    sysbvm_chunkedAllocator_allocateWithDualMapping
              (&(jit->context->heap).codeAllocator,0x10,0x10,&local_28,&local_30);
    _Var1 = sysbvm_virtualMemory_lockCodePagesForWriting(local_28,local_30,0x10);
    if (!_Var1) {
      abort();
    }
    *local_28 = 0xcccccccccccccccc;
    local_28[1] = 0xcccccccccccccccc;
    *(undefined4 *)local_28 = 0xfa1e0ff3;
    *(undefined2 *)((long)local_28 + 4) = 0xb848;
    *(undefined1 *)((long)local_28 + 6) = 0xa4;
    *(undefined1 *)((long)local_28 + 7) = 0x33;
    *(undefined1 *)(local_28 + 1) = 0x14;
    *(undefined1 *)((long)local_28 + 9) = 0;
    *(undefined1 *)((long)local_28 + 10) = 0;
    *(undefined1 *)((long)local_28 + 0xb) = 0;
    *(undefined1 *)((long)local_28 + 0xc) = 0;
    *(undefined1 *)((long)local_28 + 0xd) = 0;
    *(undefined2 *)((long)local_28 + 0xe) = 0xe0ff;
    sysbvm_virtualMemory_unlockCodePagesForExecution(local_28,local_30,0x10);
    if ((long)local_30 + 0x800000000000000U >> 0x3c == 0) {
      uVar2 = (long)local_30 << 4 | 0xc;
    }
    else {
      uVar2 = sysbvm_tuple_int64_encodeBig(jit->context,(int64_t)local_30);
    }
    bytecode->jittedCodeTrampoline = uVar2;
    if (local_28 + 0x100000000000000 < (undefined8 *)0x1000000000000000) {
      uVar2 = (long)local_28 << 4 | 0xc;
    }
    else {
      uVar2 = sysbvm_tuple_int64_encodeBig(jit->context,(int64_t)local_28);
    }
    bytecode->jittedCodeTrampolineWritePointer = uVar2;
    bytecode->jittedCodeTrampolineSessionToken = (jit->context->roots).sessionToken;
  }
  else if ((uVar2 & 0xf) == 0) {
    local_30 = *(void **)(uVar2 + 0x10);
  }
  else {
    local_30 = (void *)((long)uVar2 >> 4);
  }
  return local_30;
}

Assistant:

static void *sysbvm_jit_getTrampolineOrEntryPointForBytecode(sysbvm_bytecodeJit_t *jit, sysbvm_functionBytecode_t *bytecode)
{
    // Attempt direct entry first.
    if(bytecode->jittedCode && bytecode->jittedCodeSessionToken == jit->context->roots.sessionToken)
        return (void*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCode);

    if(bytecode->jittedCodeTrampoline && bytecode->jittedCodeTrampolineSessionToken == jit->context->roots.sessionToken)
        return (void*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCodeTrampoline);

    uint64_t trampolineTargetAddress = (uint64_t)(uintptr_t)&sysbvm_bytecodeInterpreter_applyJitTrampolineDestination;

    uint8_t trampolineCode[] = {
        // Endbr64
        0xF3, 0x0F, 0x1E, 0xFA,

        // Mov64
        sysbvm_jit_x86_rex(true, false, false, false),
        0xB8 + SYSBVM_X86_RAX,
        trampolineTargetAddress & 0xFF, (trampolineTargetAddress >> 8) & 0xFF, (trampolineTargetAddress >> 16) & 0xFF, (trampolineTargetAddress >> 24) & 0xFF,
        (trampolineTargetAddress >> 32) & 0xFF, (trampolineTargetAddress >> 40) & 0xFF, (trampolineTargetAddress >> 48) & 0xFF, (trampolineTargetAddress >> 56) & 0xFF,

        // Jmp RAX
        0xFF,
        sysbvm_jit_x86_modRMRegister(SYSBVM_X86_RAX, 4),
    };

    // Install the trampoline in the code zone.
    size_t trampolineCodeSize = sizeof(trampolineCode);
    size_t requiredCodeSize = sysbvm_sizeAlignedTo(trampolineCodeSize, 16);

    uint8_t *trampolineWritePointer = NULL;
    uint8_t *trampolineExecutablePointer = NULL;
    sysbvm_chunkedAllocator_allocateWithDualMapping(&jit->context->heap.codeAllocator, requiredCodeSize, 16, (void**)&trampolineWritePointer, (void**)&trampolineExecutablePointer);
    if(!sysbvm_virtualMemory_lockCodePagesForWriting(trampolineWritePointer, trampolineExecutablePointer, requiredCodeSize))
        abort();

    memset(trampolineWritePointer, 0xcc, requiredCodeSize); // int3;
    memcpy(trampolineWritePointer, trampolineCode, trampolineCodeSize);

    sysbvm_virtualMemory_unlockCodePagesForExecution(trampolineWritePointer, trampolineExecutablePointer, requiredCodeSize);

    bytecode->jittedCodeTrampoline = sysbvm_tuple_systemHandle_encode(jit->context, (sysbvm_systemHandle_t)(uintptr_t)trampolineExecutablePointer);
    bytecode->jittedCodeTrampolineWritePointer = sysbvm_tuple_systemHandle_encode(jit->context, (sysbvm_systemHandle_t)(uintptr_t)trampolineWritePointer);
    bytecode->jittedCodeTrampolineSessionToken = jit->context->roots.sessionToken;

    return trampolineExecutablePointer;
}